

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PClass::DestroySpecials(PClass *this,void *addr)

{
  pair<const_PType_*,_unsigned_int> *ppVar1;
  ulong uVar2;
  pair<const_PType_*,_unsigned_int> *ppVar3;
  
  if (this->bRuntimeClass == true) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0xc78,"void PClass::DestroySpecials(void *) const");
    }
    DestroySpecials(this->ParentClass,addr);
    uVar2 = (ulong)(this->SpecialInits).Count;
    if (uVar2 != 0) {
      ppVar1 = (this->SpecialInits).Array;
      ppVar3 = ppVar1 + uVar2;
      do {
        (*(ppVar1->first->super_PTypeBase).super_DObject._vptr_DObject[0xe])
                  (ppVar1->first,(ulong)ppVar1->second + (long)addr);
        ppVar1 = ppVar1 + 1;
      } while (ppVar1 != ppVar3);
    }
  }
  return;
}

Assistant:

void PClass::DestroySpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle deinitialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->DestroySpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->DestroyValue((BYTE *)addr + tao.second);
	}
}